

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bt_peer_connection.cpp
# Opt level: O3

void __thiscall libtorrent::bt_peer_connection::write_bitfield(bt_peer_connection *this)

{
  _Atomic_word *p_Var1;
  undefined1 *puVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  _Head_base<0UL,_libtorrent::piece_picker_*,_false> this_00;
  pointer psVar4;
  counters *this_01;
  byte bVar5;
  ushort uVar8;
  ushort uVar9;
  ushort uVar10;
  ushort uVar11;
  long lVar12;
  size_type *psVar13;
  undefined8 uVar14;
  byte bVar15;
  int iVar16;
  ulong uVar17;
  typed_bitfield<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>
  *ptVar18;
  pointer psVar19;
  long lVar20;
  int iVar21;
  int val;
  uint uVar22;
  char *pcVar23;
  stats_counter_t counter;
  size_t __n;
  byte *pbVar24;
  element_type *this_02;
  uint uVar25;
  message_type type;
  piece_index_t pVar27;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_03;
  bool bVar28;
  span<const_char> buf;
  undefined8 uStack_80;
  undefined8 local_78;
  string bitfield_string;
  byte bVar6;
  byte bVar7;
  int iVar26;
  
  this_02 = (this->super_peer_connection).super_peer_connection_hot_members.m_torrent.
            super___weak_ptr<libtorrent::torrent,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var3 = (this->super_peer_connection).super_peer_connection_hot_members.m_torrent.
           super___weak_ptr<libtorrent::torrent,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (__libc_single_threaded == '\0') {
    LOCK();
    p_Var3->_M_weak_count = p_Var3->_M_weak_count + 1;
    UNLOCK();
  }
  else {
    p_Var3->_M_weak_count = p_Var3->_M_weak_count + 1;
  }
  iVar16 = p_Var3->_M_use_count;
  do {
    if (iVar16 == 0) {
      this_02 = (torrent *)0x0;
      this_03 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      goto LAB_0021ba17;
    }
    LOCK();
    iVar26 = p_Var3->_M_use_count;
    bVar28 = iVar16 == iVar26;
    if (bVar28) {
      p_Var3->_M_use_count = iVar16 + 1;
      iVar26 = iVar16;
    }
    iVar16 = iVar26;
    UNLOCK();
  } while (!bVar28);
  this_03 = p_Var3;
  if (p_Var3->_M_use_count == 0) {
    this_02 = (torrent *)0x0;
  }
LAB_0021ba17:
  if (__libc_single_threaded == '\0') {
    LOCK();
    p_Var1 = &p_Var3->_M_weak_count;
    iVar16 = *p_Var1;
    *p_Var1 = *p_Var1 + -1;
    UNLOCK();
  }
  else {
    iVar16 = p_Var3->_M_weak_count;
    p_Var3->_M_weak_count = iVar16 + -1;
  }
  if (iVar16 == 1) {
    uStack_80 = 0x21ba3c;
    (*p_Var3->_vptr__Sp_counted_base[3])();
  }
  if ((this_02->field_0x5b0 & 8) != 0) {
    uStack_80 = 0x21bb68;
    peer_connection::peer_log
              (&this->super_peer_connection,info,"BITFIELD","not sending bitfield, super seeding");
    bVar15 = (this->super_peer_connection).field_0x765;
    if ((bVar15 & 4) != 0) {
      (this->super_peer_connection).field_0x765 = bVar15 | 8;
      uStack_80 = 0x21bb92;
      peer_connection::peer_log(&this->super_peer_connection,outgoing_message,"HAVE_NONE");
      uStack_80 = 0x21bba4;
      send_message<>(this,msg_have_none,num_outgoing_have_none);
      bVar15 = (this->super_peer_connection).field_0x765;
    }
    (this->super_peer_connection).field_0x765 = bVar15 | 8;
    uStack_80 = 0x21bbbe;
    ptVar18 = peer_connection::get_bitfield(&this->super_peer_connection);
    uStack_80 = 0x21bbc9;
    pVar27 = torrent::get_piece_to_super_seed(this_02,ptVar18);
    if (-1 < pVar27.m_val) {
      uStack_80 = 0x21bbdc;
      peer_connection::superseed_piece
                (&this->super_peer_connection,(piece_index_t)0xffffffff,pVar27);
    }
    uStack_80 = 0x21bbe4;
    ptVar18 = peer_connection::get_bitfield(&this->super_peer_connection);
    uStack_80 = 0x21bbef;
    pVar27 = torrent::get_piece_to_super_seed(this_02,ptVar18);
    pcVar23 = (char *)&local_78;
    if (-1 < pVar27.m_val) {
      uStack_80 = 0x21bc06;
      peer_connection::superseed_piece
                (&this->super_peer_connection,(piece_index_t)0xffffffff,pVar27);
      pcVar23 = (char *)&local_78;
    }
    goto LAB_0021be37;
  }
  if (((this->super_peer_connection).field_0x765 & 4) != 0) {
    uStack_80 = 0x21bc13;
    bVar28 = torrent::is_seed(this_02);
    bVar15 = (this->super_peer_connection).field_0x765;
    if (bVar28) {
      counter = num_outgoing_have_all;
      type = msg_have_all;
      pcVar23 = "HAVE_ALL";
LAB_0021bc31:
      (this->super_peer_connection).field_0x765 = bVar15 | 8;
      uStack_80 = 0x21bc49;
      peer_connection::peer_log(&this->super_peer_connection,outgoing_message,pcVar23);
      uStack_80 = 0x21bc56;
      send_message<>(this,type,counter);
      pcVar23 = (char *)&local_78;
      goto LAB_0021be37;
    }
    if ((bVar15 & 4) != 0) {
      uStack_80 = 0x21bc97;
      iVar16 = torrent::num_have(this_02);
      if (iVar16 == 0) {
        bVar15 = (this->super_peer_connection).field_0x765;
        counter = num_outgoing_have_none;
        type = msg_have_none;
        pcVar23 = "HAVE_NONE";
        goto LAB_0021bc31;
      }
    }
  }
  uStack_80 = 0x21ba61;
  iVar16 = torrent::num_have(this_02);
  if (iVar16 == 0) {
    uStack_80 = 0x21bc78;
    peer_connection::peer_log
              (&this->super_peer_connection,info,"BITFIELD","not sending bitfield, have none");
    puVar2 = &(this->super_peer_connection).field_0x765;
    *puVar2 = *puVar2 | 8;
    pcVar23 = (char *)&local_78;
  }
  else {
    iVar16 = (((this_02->super_torrent_hot_members).m_torrent_file.
               super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
             m_files).m_num_pieces;
    iVar26 = iVar16 + 0xe;
    if (-1 < iVar16 + 7) {
      iVar26 = iVar16 + 7;
    }
    uVar25 = iVar26 >> 3;
    __n = (size_t)(int)uVar25;
    uVar17 = __n + 0x14 & 0xfffffffffffffff0;
    lVar12 = -uVar17;
    uVar22 = uVar25 + 1;
    uVar9 = (ushort)((uVar22 & 0xff00ff) >> 0x10);
    uVar10 = (ushort)(uVar22 >> 8) & 0xff;
    uVar11 = (ushort)(uVar22 & 0xff00ff);
    bVar15 = (byte)(uVar22 >> 0x18);
    uVar8 = (ushort)bVar15;
    bVar15 = (uVar8 != 0) * (uVar8 < 0x100) * bVar15 - (0xff < uVar8);
    bVar5 = ((uVar22 & 0xff0000) != 0) * (uVar9 < 0x100) * (char)(uVar22 >> 0x10) - (0xff < uVar9);
    bVar6 = ((uVar22 & 0xff00) != 0) * (uVar10 < 0x100) * (char)(uVar22 >> 8) - (0xff < uVar10);
    bVar7 = ((uVar22 & 0xff) != 0) * (uVar11 < 0x100) * (char)uVar22 - (0xff < uVar11);
    *(uint *)((long)&local_78 - uVar17) =
         CONCAT13((bVar7 != 0) * (bVar7 < 0x100) * bVar7 - (0xff < bVar7),
                  CONCAT12((bVar6 != 0) * (bVar6 < 0x100) * bVar6 - (0xff < bVar6),
                           CONCAT11((bVar5 != 0) * (bVar5 < 0x100) * bVar5 - (0xff < bVar5),
                                    (bVar15 != 0) * (bVar15 < 0x100) * bVar15 - (0xff < bVar15))));
    *(undefined1 *)((long)&local_78 + lVar12 + 4) = 5;
    *(undefined8 *)((long)&uStack_80 + lVar12) = 0x21baf9;
    bVar28 = torrent::is_seed(this_02);
    bitfield_string.field_2._8_8_ = __n + 5;
    pbVar24 = (byte *)((long)&local_78 + lVar12 + 5);
    if (bVar28) {
      if (0 < iVar16) {
        *(undefined8 *)((long)&uStack_80 + lVar12) = 0x21bb2e;
        memset(pbVar24,0xff,(ulong)uVar25);
      }
      *(char *)((long)&uStack_80 + bitfield_string.field_2._8_8_ + lVar12 + 7) =
           (char)(0xff << (-(char)iVar16 & 7U));
    }
    else {
      pVar27.m_val = 0;
      *(undefined8 *)((long)&uStack_80 + lVar12) = 0x21bccb;
      memset(pbVar24,0,__n);
      if (0 < iVar16) {
        this_00._M_head_impl =
             (this_02->super_torrent_hot_members).m_picker._M_t.
             super___uniq_ptr_impl<libtorrent::piece_picker,_std::default_delete<libtorrent::piece_picker>_>
             ._M_t.
             super__Tuple_impl<0UL,_libtorrent::piece_picker_*,_std::default_delete<libtorrent::piece_picker>_>
             .super__Head_base<0UL,_libtorrent::piece_picker_*,_false>._M_head_impl;
        uVar22 = 0x80;
        do {
          *(undefined8 *)((long)&uStack_80 + lVar12) = 0x21bcea;
          bVar28 = piece_picker::have_piece(this_00._M_head_impl,pVar27);
          if (bVar28) {
            *pbVar24 = *pbVar24 | (byte)uVar22;
          }
          pbVar24 = pbVar24 + (uVar22 < 2);
          bVar28 = uVar22 < 2;
          uVar22 = (int)uVar22 >> 1;
          if (bVar28) {
            uVar22 = 0x80;
          }
          pVar27.m_val = pVar27.m_val + 1;
        } while (iVar16 != pVar27.m_val);
      }
    }
    psVar4 = (this_02->m_predictive_pieces).
             super__Vector_base<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (psVar19 = (this_02->m_predictive_pieces).
                   super__Vector_base<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; psVar19 != psVar4;
        psVar19 = psVar19 + 1) {
      iVar26 = psVar19->m_val;
      iVar21 = iVar26 + 7;
      if (-1 < iVar26) {
        iVar21 = iVar26;
      }
      pbVar24 = (byte *)((long)&local_78 + (iVar21 >> 3) + lVar12 + 5);
      *pbVar24 = *pbVar24 | (byte)(0x80 >> ((byte)iVar26 & 7));
    }
    *(undefined8 *)((long)&uStack_80 + lVar12) = 0x21bd69;
    bVar28 = peer_connection::should_log(&this->super_peer_connection,outgoing_message);
    if (bVar28) {
      bitfield_string._M_dataplus._M_p = (pointer)0x0;
      bitfield_string._M_string_length._0_1_ = 0;
      local_78 = &bitfield_string._M_string_length;
      *(undefined8 *)((long)&uStack_80 + lVar12) = 0x21bd97;
      std::__cxx11::string::resize((ulong)&local_78,(char)iVar16);
      psVar13 = local_78;
      if (iVar16 != 0) {
        lVar20 = 0;
        do {
          iVar26 = (int)lVar20;
          iVar21 = iVar26 + 7;
          if (-1 < iVar26) {
            iVar21 = iVar26;
          }
          *(byte *)((long)local_78 + lVar20) =
               (byte)~(*(char *)((long)&local_78 + (iVar21 >> 3) + lVar12 + 5) << ((byte)lVar20 & 7)
                      ) >> 7 ^ 0x31;
          lVar20 = lVar20 + 1;
        } while (iVar16 != lVar20);
      }
      *(undefined8 *)((long)&uStack_80 + lVar12) = 0x21bdf1;
      peer_connection::peer_log
                (&this->super_peer_connection,outgoing_message,"BITFIELD","%s",psVar13);
      psVar13 = local_78;
      if (local_78 != &bitfield_string._M_string_length) {
        lVar20 = CONCAT71(bitfield_string._M_string_length._1_7_,
                          (undefined1)bitfield_string._M_string_length);
        *(undefined8 *)((long)&uStack_80 + lVar12) = 0x21be06;
        operator_delete(psVar13,lVar20 + 1);
      }
    }
    uVar14 = bitfield_string.field_2._8_8_;
    puVar2 = &(this->super_peer_connection).field_0x765;
    *puVar2 = *puVar2 | 8;
    *(undefined8 *)((long)&uStack_80 + lVar12) = 0x21be1d;
    buf.m_len = uVar14;
    buf.m_ptr = (char *)((long)&local_78 + lVar12);
    peer_connection::send_buffer(&this->super_peer_connection,buf);
    this_01 = (this->super_peer_connection).m_counters;
    *(undefined8 *)((long)&uStack_80 + lVar12) = 0x21be37;
    counters::inc_stats_counter(this_01,0x5b,1);
    pcVar23 = (char *)((long)&local_78 + lVar12);
  }
LAB_0021be37:
  if (this_03 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    pcVar23[-8] = 'D';
    pcVar23[-7] = -0x42;
    pcVar23[-6] = '!';
    pcVar23[-5] = '\0';
    pcVar23[-4] = '\0';
    pcVar23[-3] = '\0';
    pcVar23[-2] = '\0';
    pcVar23[-1] = '\0';
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_03);
  }
  return;
}

Assistant:

void bt_peer_connection::write_bitfield()
	{
		INVARIANT_CHECK;

		// if we have not received the other peer's extension bits yet, how do we
		// know whether to send a have-all or have-none?
		TORRENT_ASSERT(m_state >= state_t::read_peer_id);

		std::shared_ptr<torrent> t = associated_torrent().lock();
		TORRENT_ASSERT(t);
		TORRENT_ASSERT(m_sent_handshake);
		TORRENT_ASSERT(t->valid_metadata());

#ifndef TORRENT_DISABLE_SUPERSEEDING
		if (t->super_seeding())
		{
#ifndef TORRENT_DISABLE_LOGGING
			peer_log(peer_log_alert::info, "BITFIELD", "not sending bitfield, super seeding");
#endif
			if (m_supports_fast) write_have_none();

			// if we are super seeding, pretend to not have any piece
			// and don't send a bitfield
			m_sent_bitfield = true;

			// bootstrap super-seeding by sending two have message
			piece_index_t piece = t->get_piece_to_super_seed(get_bitfield());
			if (piece >= piece_index_t(0)) superseed_piece(piece_index_t(-1), piece);
			piece = t->get_piece_to_super_seed(get_bitfield());
			if (piece >= piece_index_t(0)) superseed_piece(piece_index_t(-1), piece);
			return;
		}
		else
#endif
			if (m_supports_fast && t->is_seed())
		{
			write_have_all();
			return;
		}
		else if (m_supports_fast && t->num_have() == 0)
		{
			write_have_none();
			return;
		}
		else if (t->num_have() == 0)
		{
			// don't send a bitfield if we don't have any pieces
#ifndef TORRENT_DISABLE_LOGGING
			peer_log(peer_log_alert::info, "BITFIELD", "not sending bitfield, have none");
#endif
			m_sent_bitfield = true;
			return;
		}

		const int num_pieces = t->torrent_file().num_pieces();
		TORRENT_ASSERT(num_pieces > 0);

		constexpr std::uint8_t char_bit_mask = CHAR_BIT - 1;
		constexpr std::uint8_t char_top_bit = 1 << (CHAR_BIT - 1);

		const int packet_size = (num_pieces + char_bit_mask) / CHAR_BIT + 5;

		TORRENT_ALLOCA(msg, char, packet_size);
		if (msg.data() == nullptr) return; // out of memory
		auto ptr = msg.begin();

		detail::write_int32(packet_size - 4, ptr);
		detail::write_uint8(msg_bitfield, ptr);

		if (t->is_seed())
		{
			std::fill_n(ptr, packet_size - 5, std::uint8_t{0xff});

			// Clear trailing bits
			msg.back() = static_cast<char>((0xff << ((CHAR_BIT - (num_pieces & char_bit_mask)) & char_bit_mask)) & 0xff);
		}
		else
		{
			std::memset(ptr, 0, aux::numeric_cast<std::size_t>(packet_size - 5));
			piece_picker const& p = t->picker();
			int mask = char_top_bit;
			for (piece_index_t i(0); i < piece_index_t(num_pieces); ++i)
			{
				if (p.have_piece(i)) *ptr |= mask;
				mask >>= 1;
				if (mask == 0)
				{
					mask = char_top_bit;
					++ptr;
				}
			}
		}

#ifndef TORRENT_DISABLE_PREDICTIVE_PIECES
		// add predictive pieces to the bitfield as well, since we won't
		// announce them again
		for (piece_index_t const p : t->predictive_pieces())
			msg[5 + static_cast<int>(p) / CHAR_BIT] |= (char_top_bit >> (static_cast<int>(p) & char_bit_mask));
#endif

#ifndef TORRENT_DISABLE_LOGGING
		if (should_log(peer_log_alert::outgoing_message))
		{
			std::string bitfield_string;
			std::size_t const n_pieces = aux::numeric_cast<std::size_t>(num_pieces);
			bitfield_string.resize(n_pieces);
			for (std::size_t k = 0; k < n_pieces; ++k)
			{
				if (msg[5 + int(k) / CHAR_BIT] & (char_top_bit >> (k % CHAR_BIT))) bitfield_string[k] = '1';
				else bitfield_string[k] = '0';
			}
			peer_log(peer_log_alert::outgoing_message, "BITFIELD"
				, "%s", bitfield_string.c_str());
		}
#endif
		m_sent_bitfield = true;

		send_buffer(msg);

		stats_counters().inc_stats_counter(counters::num_outgoing_bitfield);
	}